

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

Value * duckdb::MaxMemorySetting::GetSetting(Value *__return_storage_ptr__,ClientContext *context)

{
  DBConfig *pDVar1;
  idx_t in_RCX;
  string local_30;
  
  pDVar1 = DBConfig::GetConfig(context);
  StringUtil::BytesToHumanReadableString_abi_cxx11_
            (&local_30,(StringUtil *)(pDVar1->options).maximum_memory,0x400,in_RCX);
  Value::Value(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Value MaxMemorySetting::GetSetting(const ClientContext &context) {
	auto &config = DBConfig::GetConfig(context);
	return Value(StringUtil::BytesToHumanReadableString(config.options.maximum_memory));
}